

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

void setarrayvector(lua_State *L,Table *t,uint size)

{
  uint uVar1;
  TValue *pTVar2;
  int *piVar3;
  long lVar4;
  
  pTVar2 = (TValue *)luaM_realloc_(L,t->array,(ulong)t->sizearray << 4,(ulong)size << 4);
  t->array = pTVar2;
  uVar1 = t->sizearray;
  if (uVar1 < size) {
    lVar4 = (ulong)size - (ulong)uVar1;
    piVar3 = &pTVar2[uVar1].tt_;
    do {
      *piVar3 = 0;
      piVar3 = piVar3 + 4;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  t->sizearray = size;
  return;
}

Assistant:

static void setarrayvector (lua_State *L, Table *t, unsigned int size) {
  unsigned int i;
  luaM_reallocvector(L, t->array, t->sizearray, size, TValue);
  for (i=t->sizearray; i<size; i++)
     setnilvalue(&t->array[i]);
  t->sizearray = size;
}